

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverTest_MergeFeaturesDistantFuture_Test::TestBody
          (FeatureResolverTest_MergeFeaturesDistantFuture_Test *this)

{
  bool bVar1;
  char *message;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *gmock_p0;
  HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *matcher;
  AssertHelper local_198;
  Message local_190;
  StatusOr<google::protobuf::FeatureResolver> local_188;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  AllOfMatcher<typename_std::decay<const_PolymorphicMatcher<HasSubstrMatcher<basic_string<char>_>_>_&>::type,_typename_std::decay<const_PolymorphicMatcher<HasSubstrMatcher<basic_string<char>_>_>_&>::type>
  local_e0;
  HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a0;
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_60;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  FeatureResolverTest_MergeFeaturesDistantFuture_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  testing::HasSubstr<char[24]>(&local_100,(StringLike<char[24]> *)"Edition 99998_TEST_ONLY");
  testing::HasSubstr<char[42]>
            (&local_120,(StringLike<char[42]> *)"maximum supported edition 99997_TEST_ONLY");
  testing::
  AllOf<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_e0,(testing *)&local_100,&local_120,in_RCX);
  protobuf::(anonymous_namespace)::
  HasError<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
            (&local_a0,(_anonymous_namespace_ *)&local_e0,gmock_p0);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>>
            (&local_60,(internal *)&local_a0,matcher);
  SetupFeatureResolver<>(&local_188,EDITION_99998_TEST_ONLY);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>>
  ::operator()(local_20,(char *)&local_60,
               (StatusOr<google::protobuf::FeatureResolver> *)
               "SetupFeatureResolver(EDITION_99998_TEST_ONLY)");
  absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::~StatusOr(&local_188);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_60);
  HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~HasErrorMatcherP(&local_a0);
  testing::internal::
  VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~VariadicMatcher(&local_e0);
  testing::
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_120);
  testing::
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
               ,0x232,message);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(FeatureResolverTest, MergeFeaturesDistantFuture) {
  EXPECT_THAT(
      SetupFeatureResolver(EDITION_99998_TEST_ONLY),
      HasError(AllOf(HasSubstr("Edition 99998_TEST_ONLY"),
                     HasSubstr("maximum supported edition 99997_TEST_ONLY"))));
}